

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse(parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *input,
     context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
     *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *root_component,
     basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *error_message)

{
  string_size_type sVar1;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pcVar2;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar3;
  string_size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar10;
  wostream *pwVar11;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  bool is_unescaped_var;
  long lVar12;
  ulong uVar13;
  size_type sVar14;
  initializer_list<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  __l;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l_00;
  bool local_369;
  string_size_type input_position;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_360;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_358;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_350;
  size_type local_348;
  string_size_type local_340;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  sections;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tag_contents;
  string_size_type current_text_position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> section_starts;
  anon_class_24_3_f3e5c141 process_current_text;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  whitespace;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> current_text;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  brace_delimiter_end_unescaped;
  allocator_type local_1c8 [32];
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp_1;
  undefined1 local_118 [232];
  
  brace_delimiter_end_unescaped._M_dataplus._M_p = (pointer)&brace_delimiter_end_unescaped.field_2;
  local_350 = error_message;
  std::__cxx11::wstring::_M_construct((ulong)&brace_delimiter_end_unescaped,L'\x03');
  sVar14 = input->_M_string_length;
  local_358 = &ctx->delim_set;
  local_360 = ctx;
  local_369 = delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::is_default(local_358);
  __l._M_len = 1;
  __l._M_array = (iterator)&comp_1;
  comp_1.text._M_dataplus._M_p = (pointer)root_component;
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ::vector(&sections,__l,(allocator_type *)&comp);
  section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  current_text._M_dataplus._M_p = (pointer)&current_text.field_2;
  current_text._M_string_length = 0;
  current_text.field_2._M_local_buf[0] = L'\0';
  section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  current_text_position = 0xffffffffffffffff;
  local_348 = sVar14;
  std::__cxx11::wstring::reserve((ulong)&current_text);
  process_current_text.current_text_position = &current_text_position;
  comp.text._M_dataplus._M_p = (pointer)&comp.text.field_2;
  process_current_text.current_text = &current_text;
  process_current_text.sections = &sections;
  std::__cxx11::wstring::_M_construct((ulong)&comp,L'\x01');
  pdVar9 = local_358;
  tag_contents._M_dataplus._M_p = (pointer)&tag_contents.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&tag_contents,L'\x01');
  std::operator+(&comp_1.text,&comp.text,&tag_contents);
  comp_1.tag.name._M_dataplus._M_p = (pointer)&comp_1.tag.name.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&comp_1.tag,L'\x01');
  comp_1.tag._32_8_ =
       &comp_1.tag.section_text.
        super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount;
  std::__cxx11::wstring::_M_construct((ulong)&comp_1.tag.type,L'\x01');
  comp_1.tag.delim_set.
  super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &comp_1.children.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::wstring::_M_construct
            ((ulong)&comp_1.tag.delim_set.
                     super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,L'\x01');
  comp_1.position = (string_size_type)local_118;
  std::__cxx11::wstring::_M_construct((ulong)&comp_1.position,L'\x01');
  __l_00._M_len = 5;
  __l_00._M_array = &comp_1.text;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&whitespace,__l_00,local_1c8);
  lVar12 = 0x80;
  do {
    std::__cxx11::wstring::~wstring((wstring *)((long)&comp_1.text._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x20);
  std::__cxx11::wstring::~wstring((wstring *)&tag_contents);
  std::__cxx11::wstring::~wstring((wstring *)&comp);
  input_position = 0;
  sVar1 = local_348 - 2;
  pdVar3 = &local_360->delim_set;
LAB_001ea6d1:
  do {
    if (input_position == local_348) {
      parse::anon_class_24_3_f3e5c141::operator()(&process_current_text);
      comp_1.text._M_string_length = 0;
      comp_1.text._M_dataplus._M_p = (pointer)local_350;
      comp_1.text.field_2._8_8_ =
           Catch::clara::std::
           _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
           ::_M_invoke;
      comp_1.text.field_2._M_allocated_capacity =
           (size_type)
           Catch::clara::std::
           _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
           ::_M_manager;
      component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::walk_children(root_component,(walk_callback *)&comp_1);
      Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&comp_1);
LAB_001eac6f:
      Catch::clara::std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::~vector(&whitespace);
      std::__cxx11::wstring::~wstring((wstring *)&current_text);
      Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      Catch::clara::std::
      _Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
      ::~_Vector_base(&sections.
                       super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                     );
      std::__cxx11::wstring::~wstring((wstring *)&brace_delimiter_end_unescaped);
      return;
    }
    iVar7 = std::__cxx11::wstring::compare
                      ((ulong)input,input_position,
                       (wstring *)(local_360->delim_set).begin._M_string_length);
    pbVar5 = whitespace.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = whitespace.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (iVar7 != 0) {
      for (; pbVar10 != pbVar5; pbVar10 = pbVar10 + 1) {
        iVar7 = std::__cxx11::wstring::compare
                          ((ulong)input,input_position,(wstring *)pbVar10->_M_string_length);
        if (iVar7 == 0) {
          parse::anon_class_24_3_f3e5c141::operator()(&process_current_text);
          component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::component(&comp_1,pbVar10,input_position);
          Catch::clara::std::
          vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ::push_back(&sections.
                       super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->children,&comp_1);
          input_position = input_position + pbVar10->_M_string_length;
          component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::~component(&comp_1);
          goto LAB_001ea6d1;
        }
      }
      if (current_text._M_string_length == 0) {
        current_text_position = input_position;
      }
      std::__cxx11::wstring::append((ulong)&current_text,L'\x01');
      input_position = input_position + 1;
      goto LAB_001ea6d1;
    }
    parse::anon_class_24_3_f3e5c141::operator()(&process_current_text);
    uVar13 = (local_360->delim_set).begin._M_string_length + input_position;
    local_340 = input_position;
    if ((local_369 & input_position != sVar1) == 0) {
      sVar14 = (local_360->delim_set).end._M_string_length;
LAB_001ea838:
      is_unescaped_var = false;
      pbVar10 = &pdVar3->end;
    }
    else {
      piVar8 = (int *)std::__cxx11::wstring::at((ulong)input);
      iVar7 = *piVar8;
      piVar8 = (int *)std::__cxx11::wstring::at((ulong)pdVar9);
      if (iVar7 != *piVar8) {
        sVar14 = (local_360->delim_set).end._M_string_length;
        goto LAB_001ea838;
      }
      uVar13 = uVar13 + 1;
      is_unescaped_var = true;
      pbVar10 = &brace_delimiter_end_unescaped;
      sVar14 = brace_delimiter_end_unescaped._M_string_length;
    }
    lVar12 = std::__cxx11::wstring::find((wstring *)input,(ulong)pbVar10);
    if (lVar12 == -1) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&comp_1);
      pwVar11 = std::operator<<((wostream *)&comp_1,"Unclosed tag at ");
      std::wostream::_M_insert<unsigned_long>((ulong)pwVar11);
      std::__cxx11::wstringbuf::str();
      std::__cxx11::wstring::operator=((wstring *)local_350,(wstring *)&comp);
      std::__cxx11::wstring::~wstring((wstring *)&comp);
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)&comp_1);
      goto LAB_001eac6f;
    }
    std::__cxx11::wstring::wstring((wstring *)&comp_1,(wstring *)input,uVar13,lVar12 - uVar13);
    trim<std::__cxx11::wstring>(&tag_contents,(mustache *)&comp_1,s);
    std::__cxx11::wstring::~wstring((wstring *)&comp_1);
    sVar4 = local_340;
    comp.text._M_dataplus._M_p = (pointer)&comp.text.field_2;
    comp.text._M_string_length = 0;
    comp.text.field_2._M_local_buf[0] = L'\0';
    comp.tag.name._M_dataplus._M_p = (pointer)&comp.tag.name.field_2;
    comp.tag.name._M_string_length = 0;
    comp.tag.name.field_2._M_local_buf[0] = L'\0';
    comp.tag.type = text;
    comp.children.
    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comp.children.
    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comp.tag.delim_set.
    super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    comp.tag.delim_set.
    super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    comp.children.
    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comp.tag.section_text.
    super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    comp.tag.section_text.
    super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    comp.position = 0xffffffffffffffff;
    if ((tag_contents._M_string_length != 0) && (*tag_contents._M_dataplus._M_p == L'=')) {
      bVar6 = parse_set_delimiter_tag(this,&tag_contents,local_358);
      if (bVar6) {
        local_369 = delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    ::is_default(local_358);
        comp.tag.type = set_delimiter;
        pdVar9 = (delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)operator_new(0x40);
        delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::delimiter_set(pdVar9,local_358);
        std::
        __shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
        ::reset<kainjow::mustache::delimiter_set<std::__cxx11::wstring>>
                  ((__shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
                    *)&comp.tag.delim_set,pdVar9);
        if (comp.tag.type != set_delimiter) goto LAB_001ea986;
        goto LAB_001ea9a3;
      }
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&comp_1);
      pwVar11 = std::operator<<((wostream *)&comp_1,"Invalid set delimiter tag at ");
      std::wostream::_M_insert<unsigned_long>((ulong)pwVar11);
      std::__cxx11::wstringbuf::str();
LAB_001eac2e:
      std::__cxx11::wstring::operator=((wstring *)local_350,(wstring *)local_1c8);
      std::__cxx11::wstring::~wstring((wstring *)local_1c8);
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)&comp_1);
      component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~component(&comp);
      std::__cxx11::wstring::~wstring((wstring *)&tag_contents);
      goto LAB_001eac6f;
    }
LAB_001ea986:
    parse_tag_contents(this,is_unescaped_var,&tag_contents,&comp.tag);
LAB_001ea9a3:
    comp.position = sVar4;
    Catch::clara::std::
    vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ::push_back(&sections.
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->children,&comp);
    input_position = lVar12 + sVar14;
    if (comp.tag.type == section_begin_inverted) {
LAB_001ea9e7:
      comp_1.text._M_dataplus._M_p =
           (pointer)((sections.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]->children).
                     super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::
      vector<kainjow::mustache::component<std::__cxx11::wstring>*,std::allocator<kainjow::mustache::component<std::__cxx11::wstring>*>>
      ::emplace_back<kainjow::mustache::component<std::__cxx11::wstring>*>
                ((vector<kainjow::mustache::component<std::__cxx11::wstring>*,std::allocator<kainjow::mustache::component<std::__cxx11::wstring>*>>
                  *)&sections,
                 (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  **)&comp_1);
      Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&section_starts,&input_position);
    }
    else if (comp.tag.type == section_end) {
      if ((long)sections.
                super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)sections.
                super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&comp_1);
        pwVar11 = std::operator<<((wostream *)&comp_1,"Unopened section \"");
        pwVar11 = std::operator<<(pwVar11,(wstring *)&comp.tag);
        pwVar11 = std::operator<<(pwVar11,"\" at ");
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar11);
        std::__cxx11::wstringbuf::str();
        goto LAB_001eac2e;
      }
      pcVar2 = sections.
               super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      pbVar10 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                operator_new(0x20);
      std::__cxx11::wstring::substr((ulong)pbVar10,(ulong)input);
      std::__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2>::
      reset<std::__cxx11::wstring>
                ((__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2> *)
                 &(pcVar2->tag).section_text,pbVar10);
      sections.
      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           sections.
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           section_starts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    }
    else if (comp.tag.type == section_begin) goto LAB_001ea9e7;
    component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::~component(&comp);
    std::__cxx11::wstring::~wstring((wstring *)&tag_contents);
    pdVar9 = local_358;
  } while( true );
}

Assistant:

void parse(const string_type& input, context_internal<string_type>& ctx, component<string_type>& root_component, string_type& error_message) const {
        using string_size_type = typename string_type::size_type;
        using streamstring = std::basic_ostringstream<typename string_type::value_type>;

        const string_type brace_delimiter_end_unescaped(3, '}');
        const string_size_type input_size{input.size()};

        bool current_delimiter_is_brace{ctx.delim_set.is_default()};

        std::vector<component<string_type>*> sections{&root_component};
        std::vector<string_size_type> section_starts;
        string_type current_text;
        string_size_type current_text_position = string_type::npos;

        current_text.reserve(input_size);

        const auto process_current_text = [&current_text, &current_text_position, &sections]() {
            if (!current_text.empty()) {
                const component<string_type> comp{current_text, current_text_position};
                sections.back()->children.push_back(comp);
                current_text.clear();
                current_text_position = string_type::npos;
            }
        };

        const std::vector<string_type> whitespace{
            string_type(1, '\r') + string_type(1, '\n'),
            string_type(1, '\n'),
            string_type(1, '\r'),
            string_type(1, ' '),
            string_type(1, '\t'),
        };

        for (string_size_type input_position = 0; input_position != input_size;) {
            bool parse_tag = false;

            if (input.compare(input_position, ctx.delim_set.begin.size(), ctx.delim_set.begin) == 0) {
                process_current_text();

                // Tag start delimiter
                parse_tag = true;
            } else {
                bool parsed_whitespace = false;
                for (const auto& whitespace_text : whitespace) {
                    if (input.compare(input_position, whitespace_text.size(), whitespace_text) == 0) {
                        process_current_text();

                        const component<string_type> comp{whitespace_text, input_position};
                        sections.back()->children.push_back(comp);
                        input_position += whitespace_text.size();

                        parsed_whitespace = true;
                        break;
                    }
                }

                if (!parsed_whitespace) {
                    if (current_text.empty()) {
                        current_text_position = input_position;
                    }
                    current_text.append(1, input[input_position]);
                    input_position++;
                }
            }

            if (!parse_tag) {
                continue;
            }

            // Find the next tag start delimiter
            const string_size_type tag_location_start = input_position;

            // Find the next tag end delimiter
            string_size_type tag_contents_location{tag_location_start + ctx.delim_set.begin.size()};
            const bool tag_is_unescaped_var{current_delimiter_is_brace && tag_location_start != (input_size - 2) && input.at(tag_contents_location) == ctx.delim_set.begin.at(0)};
            const string_type& current_tag_delimiter_end{tag_is_unescaped_var ? brace_delimiter_end_unescaped : ctx.delim_set.end};
            const auto current_tag_delimiter_end_size = current_tag_delimiter_end.size();
            if (tag_is_unescaped_var) {
                ++tag_contents_location;
            }
            const string_size_type tag_location_end{input.find(current_tag_delimiter_end, tag_contents_location)};
            if (tag_location_end == string_type::npos) {
                streamstring ss;
                ss << "Unclosed tag at " << tag_location_start;
                error_message.assign(ss.str());
                return;
            }

            // Parse tag
            const string_type tag_contents{trim(string_type{input, tag_contents_location, tag_location_end - tag_contents_location})};
            component<string_type> comp;
            if (!tag_contents.empty() && tag_contents[0] == '=') {
                if (!parse_set_delimiter_tag(tag_contents, ctx.delim_set)) {
                    streamstring ss;
                    ss << "Invalid set delimiter tag at " << tag_location_start;
                    error_message.assign(ss.str());
                    return;
                }
                current_delimiter_is_brace = ctx.delim_set.is_default();
                comp.tag.type = tag_type::set_delimiter;
                comp.tag.delim_set.reset(new delimiter_set<string_type>(ctx.delim_set));
            }
            if (comp.tag.type != tag_type::set_delimiter) {
                parse_tag_contents(tag_is_unescaped_var, tag_contents, comp.tag);
            }
            comp.position = tag_location_start;
            sections.back()->children.push_back(comp);

            // Start next search after this tag
            input_position = tag_location_end + current_tag_delimiter_end_size;

            // Push or pop sections
            if (comp.tag.is_section_begin()) {
                sections.push_back(&sections.back()->children.back());
                section_starts.push_back(input_position);
            } else if (comp.tag.is_section_end()) {
                if (sections.size() == 1) {
                    streamstring ss;
                    ss << "Unopened section \"" << comp.tag.name << "\" at " << comp.position;
                    error_message.assign(ss.str());
                    return;
                }
                sections.back()->tag.section_text.reset(new string_type(input.substr(section_starts.back(), tag_location_start - section_starts.back())));
                sections.pop_back();
                section_starts.pop_back();
            }
        }

        process_current_text();

        // Check for sections without an ending tag
        root_component.walk_children([&error_message](component<string_type>& comp) -> typename component<string_type>::walk_control {
            if (!comp.tag.is_section_begin()) {
                return component<string_type>::walk_control::walk;
            }
            if (comp.children.empty() || !comp.children.back().tag.is_section_end() || comp.children.back().tag.name != comp.tag.name) {
                streamstring ss;
                ss << "Unclosed section \"" << comp.tag.name << "\" at " << comp.position;
                error_message.assign(ss.str());
                return component<string_type>::walk_control::stop;
            }
            comp.children.pop_back(); // remove now useless end section component
            return component<string_type>::walk_control::walk;
        });
        if (!error_message.empty()) {
            return;
        }
    }